

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLimits.cpp
# Opt level: O2

void testLimits(void)

{
  uint __line;
  char *__assertion;
  float fVar1;
  half h;
  
  std::operator<<((ostream *)&std::cout,"values in std::numeric_limits<half>\n");
  std::operator<<((ostream *)&std::cout,"min_exponent\n");
  fVar1 = anon_unknown.dwarf_1056e8::mypow(2,-0xe);
  Imath_3_2::half::half(&h,fVar1);
  if (((h._h >> 10 & 0x1f) == 0x1f) || ((h._h >> 10 & 0x1f) == 0)) {
    __assertion = "h.isNormalized ()";
    __line = 0x38;
  }
  else {
    fVar1 = anon_unknown.dwarf_1056e8::mypow(2,-0xf);
    Imath_3_2::half::half(&h,fVar1);
    if (((h._h & 0x7c00) == 0) && ((h._h & 0x3ff) != 0)) {
      std::operator<<((ostream *)&std::cout,"max_exponent\n");
      fVar1 = anon_unknown.dwarf_1056e8::mypow(2,0xf);
      Imath_3_2::half::half(&h,fVar1);
      if (((h._h >> 10 & 0x1f) == 0x1f) || ((h._h >> 10 & 0x1f) == 0)) {
        __assertion = "h.isNormalized ()";
        __line = 0x44;
      }
      else {
        fVar1 = anon_unknown.dwarf_1056e8::mypow(2,0x10);
        Imath_3_2::half::half(&h,fVar1);
        if ((h._h & 0x7fff) == 0x7c00) {
          std::operator<<((ostream *)&std::cout,"min_exponent10\n");
          fVar1 = anon_unknown.dwarf_1056e8::mypow(10,-4);
          Imath_3_2::half::half(&h,fVar1);
          if (((h._h >> 10 & 0x1f) == 0x1f) || ((h._h >> 10 & 0x1f) == 0)) {
            __assertion = "h.isNormalized ()";
            __line = 0x50;
          }
          else {
            fVar1 = anon_unknown.dwarf_1056e8::mypow(10,-5);
            Imath_3_2::half::half(&h,fVar1);
            if (((h._h & 0x7c00) == 0) && ((h._h & 0x3ff) != 0)) {
              std::operator<<((ostream *)&std::cout,"max_exponent10\n");
              fVar1 = anon_unknown.dwarf_1056e8::mypow(10,4);
              Imath_3_2::half::half(&h,fVar1);
              if (((h._h >> 10 & 0x1f) == 0x1f) || ((h._h >> 10 & 0x1f) == 0)) {
                __assertion = "h.isNormalized ()";
                __line = 0x5c;
              }
              else {
                fVar1 = anon_unknown.dwarf_1056e8::mypow(10,5);
                Imath_3_2::half::half(&h,fVar1);
                if ((h._h & 0x7fff) == 0x7c00) {
                  std::operator<<((ostream *)&std::cout,"max_digits10\n");
                  std::operator<<((ostream *)&std::cout,"lowest\n");
                  if ((*(float *)(_imath_half_to_float_table + 0x3effc) == -65504.0) &&
                     (!NAN(*(float *)(_imath_half_to_float_table + 0x3effc)))) {
                    std::operator<<((ostream *)&std::cout,"ok\n\n");
                    std::ostream::flush();
                    return;
                  }
                  __assertion = "numeric_limits<half>::lowest () == -HALF_MAX";
                  __line = 0x6c;
                }
                else {
                  __assertion = "h.isInfinity ()";
                  __line = 0x61;
                }
              }
            }
            else {
              __assertion = "h.isDenormalized ()";
              __line = 0x55;
            }
          }
        }
        else {
          __assertion = "h.isInfinity ()";
          __line = 0x49;
        }
      }
    }
    else {
      __assertion = "h.isDenormalized ()";
      __line = 0x3d;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testLimits.cpp"
                ,__line,"void testLimits()");
}

Assistant:

void
testLimits ()
{
    cout << "values in std::numeric_limits<half>\n";

    cout << "min_exponent\n";

    {
        half h (mypow (2, numeric_limits<half>::min_exponent - 1));
        assert (h.isNormalized ());
    }

    {
        half h (mypow (2, numeric_limits<half>::min_exponent - 2));
        assert (h.isDenormalized ());
    }

    cout << "max_exponent\n";

    {
        half h (mypow (2, numeric_limits<half>::max_exponent - 1));
        assert (h.isNormalized ());
    }

    {
        half h (mypow (2, numeric_limits<half>::max_exponent));
        assert (h.isInfinity ());
    }

    cout << "min_exponent10\n";

    {
        half h (mypow (10, numeric_limits<half>::min_exponent10));
        assert (h.isNormalized ());
    }

    {
        half h (mypow (10, numeric_limits<half>::min_exponent10 - 1));
        assert (h.isDenormalized ());
    }

    cout << "max_exponent10\n";

    {
        half h (mypow (10, numeric_limits<half>::max_exponent10));
        assert (h.isNormalized ());
    }

    {
        half h (mypow (10, numeric_limits<half>::max_exponent10 + 1));
        assert (h.isInfinity ());
    }

#if __cplusplus >= 201103L

    cout << "max_digits10\n";
    assert (
        numeric_limits<half>::max_digits10 ==
        std::ceil (numeric_limits<half>::digits * std::log10 (2) + 1));

    cout << "lowest\n";
    assert (numeric_limits<half>::lowest () == -HALF_MAX);

#endif

    cout << "ok\n\n" << flush;
}